

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree_test.cpp
# Opt level: O2

int main(void)

{
  Status *newChildren;
  undefined1 *t;
  pointer *this;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_7e8 [8];
  Building building;
  DataContext data;
  Sequence sequence [3];
  IsNull<Door> isNull;
  GetStack<Door> getDoorStackFromBuilding;
  DoorAction walkToDoor;
  Pop<Door> popFromStack;
  SetVar<Door> setVariable;
  Select selector;
  Async async;
  Invert inverter [2];
  undefined1 local_2a0 [8];
  Succeed succeeder;
  DoorAction openDoor;
  DoorAction walkThroughDoor;
  DoorAction closeDoor;
  DoorAction unlockDoor;
  DoorAction smashDoor;
  RepeatUntil untilFail;
  BehaviourTree local_48;
  BT behaviorTree;
  
  srand(0x2a);
  BehaviourTree::BehaviourTree(&local_48);
  DataContext::DataContext((DataContext *)&building.doors.field_0xe8);
  Building::Building((Building *)local_7e8,5);
  lVar4 = 0;
  do {
    BehaviourTree::Sequence::Sequence((Sequence *)((long)sequence + lVar4 + -8));
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0xd8);
  BehaviourTree::Select::Select((Select *)&setVariable.object);
  BehaviourTree::Invert::Invert((Invert *)&async._statusPoolTime);
  BehaviourTree::Invert::Invert((Invert *)&inverter[0].super_DecoratorNode.child);
  BehaviourTree::Succeed::Succeed((Succeed *)local_2a0);
  std::__cxx11::string::string
            ((string *)&popFromStack.item,"",(allocator *)&getDoorStackFromBuilding.object);
  BehaviourTree::DecoratorNode::DecoratorNode((DecoratorNode *)&smashDoor.probabilityOfSuccess);
  smashDoor._80_8_ = &PTR__DecoratorNode_00111790;
  untilFail.super_DecoratorNode.child._0_4_ = 0;
  std::__cxx11::string::~string((string *)&popFromStack.item);
  BehaviourTree::GetStack<Door>::GetStack
            ((GetStack<Door> *)&isNull.object,(ConcurrentStack<Door_*> *)&building.doors.field_0xe8,
             (ConcurrentStack<Door_*> *)local_7e8,(Door *)0x0);
  t = &data.doors.field_0xe8;
  BehaviourTree::Pop<Door>::Pop
            ((Pop<Door> *)&walkToDoor.probabilityOfSuccess,(Door **)t,
             (ConcurrentStack<Door_*> *)&building.doors.field_0xe8);
  BehaviourTree::SetVar<Door>::SetVar
            ((SetVar<Door> *)&popFromStack.item,&data.currentDoor,(Door **)t);
  this = &sequence[2].super_CompositeNode.children.
          super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  BehaviourTree::IsNull<Door>::IsNull((IsNull<Door> *)this,&data.currentDoor);
  BehaviourTree::Async::Async
            ((Async *)&selector.super_CompositeNode.children.
                       super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(microseconds)0xa);
  std::__cxx11::string::string
            ((string *)&succeeder.super_DecoratorNode.child,"Walk to door",
             (allocator *)&closeDoor.probabilityOfSuccess);
  DoorAction::DoorAction
            ((DoorAction *)&getDoorStackFromBuilding.object,
             (string *)&succeeder.super_DecoratorNode.child,99);
  std::__cxx11::string::~string((string *)&succeeder.super_DecoratorNode.child);
  std::__cxx11::string::string
            ((string *)&closeDoor.probabilityOfSuccess,"Open door",
             (allocator *)&unlockDoor.probabilityOfSuccess);
  DoorAction::DoorAction
            ((DoorAction *)&succeeder.super_DecoratorNode.child,
             (string *)&closeDoor.probabilityOfSuccess,0xc);
  std::__cxx11::string::~string((string *)&closeDoor.probabilityOfSuccess);
  std::__cxx11::string::string
            ((string *)&unlockDoor.probabilityOfSuccess,"Unlock door",
             (allocator *)&openDoor.probabilityOfSuccess);
  DoorAction::DoorAction
            ((DoorAction *)&closeDoor.probabilityOfSuccess,
             (string *)&unlockDoor.probabilityOfSuccess,0x19);
  std::__cxx11::string::~string((string *)&unlockDoor.probabilityOfSuccess);
  std::__cxx11::string::string
            ((string *)&openDoor.probabilityOfSuccess,"Smash door",
             (allocator *)&walkThroughDoor.probabilityOfSuccess);
  DoorAction::DoorAction
            ((DoorAction *)&unlockDoor.probabilityOfSuccess,(string *)&openDoor.probabilityOfSuccess
             ,0x3c);
  std::__cxx11::string::~string((string *)&openDoor.probabilityOfSuccess);
  std::__cxx11::string::string
            ((string *)&walkThroughDoor.probabilityOfSuccess,"Walk through door",
             (allocator *)&untilFail._exitStatus);
  DoorAction::DoorAction
            ((DoorAction *)&openDoor.probabilityOfSuccess,
             (string *)&walkThroughDoor.probabilityOfSuccess,0x55);
  std::__cxx11::string::~string((string *)&walkThroughDoor.probabilityOfSuccess);
  std::__cxx11::string::string
            ((string *)&untilFail._exitStatus,"Close door",(allocator *)&behaviorTree);
  DoorAction::DoorAction
            ((DoorAction *)&walkThroughDoor.probabilityOfSuccess,(string *)&untilFail._exitStatus,
             100);
  newChildren = &untilFail._exitStatus;
  std::__cxx11::string::~string((string *)newChildren);
  ((local_48.root)->super_DecoratorNode).child = (Node *)&data.usedDoor;
  untilFail._56_8_ = &isNull.object;
  behaviorTree.root = (Root *)newChildren;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)&data.usedDoor,
             (initializer_list<BehaviourTree::Node_*> *)&behaviorTree);
  untilFail.super_DecoratorNode.super_Node._40_8_ =
       &sequence[0].super_CompositeNode.children.
        super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  behaviorTree.root = (Root *)&walkToDoor.probabilityOfSuccess;
  inverter[0].super_DecoratorNode.super_Node._40_8_ = this;
  untilFail._56_8_ = (initializer_list<BehaviourTree::Node_*> *)&behaviorTree;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)untilFail.super_DecoratorNode.super_Node._40_8_,
             (initializer_list<BehaviourTree::Node_*> *)newChildren);
  inverter[1].super_DecoratorNode.super_Node._40_8_ =
       &selector.super_CompositeNode.children.
        super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  async.super_DecoratorNode.super_Node._40_8_ =
       &sequence[1].super_CompositeNode.children.
        super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  untilFail._56_8_ = &getDoorStackFromBuilding.object;
  behaviorTree.root = (Root *)newChildren;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)async.super_DecoratorNode.super_Node._40_8_,
             (initializer_list<BehaviourTree::Node_*> *)&behaviorTree);
  untilFail._56_8_ = &succeeder.super_DecoratorNode.child;
  behaviorTree.root = (Root *)newChildren;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)&setVariable.object,
             (initializer_list<BehaviourTree::Node_*> *)&behaviorTree);
  succeeder.super_DecoratorNode.super_Node._40_8_ = &walkThroughDoor.probabilityOfSuccess;
  iVar1 = (*((local_48.root)->super_DecoratorNode).super_Node._vptr_Node[2])();
  pcVar3 = "Sorry.  You have failed to enter the building.";
  if (iVar1 == 1) {
    pcVar3 = "Congratulations!  You made it into the building!";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  DoorAction::~DoorAction((DoorAction *)&walkThroughDoor.probabilityOfSuccess);
  DoorAction::~DoorAction((DoorAction *)&openDoor.probabilityOfSuccess);
  DoorAction::~DoorAction((DoorAction *)&unlockDoor.probabilityOfSuccess);
  DoorAction::~DoorAction((DoorAction *)&closeDoor.probabilityOfSuccess);
  DoorAction::~DoorAction((DoorAction *)&succeeder.super_DecoratorNode.child);
  DoorAction::~DoorAction((DoorAction *)&getDoorStackFromBuilding.object);
  BehaviourTree::DecoratorNode::~DecoratorNode
            ((DecoratorNode *)
             &selector.super_CompositeNode.children.
              super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  BehaviourTree::Node::~Node
            ((Node *)&sequence[2].super_CompositeNode.children.
                      super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BehaviourTree::Node::~Node((Node *)&popFromStack.item);
  BehaviourTree::Node::~Node((Node *)&walkToDoor.probabilityOfSuccess);
  BehaviourTree::Node::~Node((Node *)&isNull.object);
  BehaviourTree::DecoratorNode::~DecoratorNode((DecoratorNode *)&smashDoor.probabilityOfSuccess);
  BehaviourTree::DecoratorNode::~DecoratorNode((DecoratorNode *)local_2a0);
  lVar4 = 0x38;
  do {
    BehaviourTree::DecoratorNode::~DecoratorNode
              ((DecoratorNode *)((long)&inverter[-1].super_DecoratorNode.child + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  BehaviourTree::CompositeNode::~CompositeNode((CompositeNode *)&setVariable.object);
  lVar4 = 0x90;
  do {
    BehaviourTree::CompositeNode::~CompositeNode((CompositeNode *)((long)sequence + lVar4 + -8));
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x48);
  ConcurrentStack<Door_*>::~ConcurrentStack((ConcurrentStack<Door_*> *)local_7e8);
  ConcurrentStack<Door_*>::~ConcurrentStack((ConcurrentStack<Door_*> *)&building.doors.field_0xe8);
  return 0;
}

Assistant:

int main() {
	std::srand(42);

	BT behaviorTree;
	DataContext data;

	Building building(5);  // Building with 5 doors to get in.
	BT::Sequence sequence[3];
	BT::Select selector;
	BT::Invert inverter[2];
	BT::Succeed succeeder;
	BT::RepeatUntil untilFail("", BT::Status::FAILURE);
	BT::GetStack<Door> getDoorStackFromBuilding(data.doors, building.getDoors());
	BT::Pop<Door> popFromStack(data.currentDoor, data.doors);
	BT::SetVar<Door> setVariable(data.usedDoor, data.currentDoor);
	BT::IsNull<Door> isNull(data.usedDoor);
	BT::Async async;

	// Probabilities of success
	DoorAction walkToDoor("Walk to door", 99), 
		openDoor("Open door", 12), 
		unlockDoor("Unlock door", 25), 
		smashDoor("Smash door", 60), 
		walkThroughDoor("Walk through door", 85), 
		closeDoor("Close door", 100);

	// Build the tree (last diagram of
	// http://www.gamasutra.com/blogs/ChrisSimpson/20140717/221339/Behavior_trees_for_AI_How_they_work.php )
	behaviorTree.setRootChild(&sequence[0]);
	sequence[0].addChildren({ &getDoorStackFromBuilding, &untilFail, &inverter[0] });
	untilFail.setChild(&sequence[1]);
	inverter[0].setChild(&isNull);
	sequence[1].addChildren({ &popFromStack, &inverter[1] });
	inverter[1].setChild(&async);
	async.setChild(&sequence[2]);
	sequence[2].addChildren({ &walkToDoor, &selector, &walkThroughDoor, &succeeder, &setVariable });
	selector.addChildren({ &openDoor, &unlockDoor, &smashDoor });
	succeeder.setChild(&closeDoor);

	if (behaviorTree.run() == BT::Status::SUCCESS)
		std::cout << "Congratulations!  You made it into the building!" << std::endl;
	else
		std::cout << "Sorry.  You have failed to enter the building." << std::endl;
}